

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGValidateDefinition(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define)

{
  xmlRelaxNGStatesPtr *ppxVar1;
  uint uVar2;
  xmlRelaxNGStatesPtr pxVar3;
  int iVar4;
  xmlRelaxNGValidStatePtr *ppxVar5;
  ulong uVar6;
  xmlRelaxNGStatesPtr pxVar7;
  xmlRelaxNGStatesPtr states;
  long lVar8;
  xmlRelaxNGValidStatePtr *ppxVar9;
  long lVar10;
  uint local_54;
  
  if ((ctxt->state != (xmlRelaxNGValidStatePtr)0x0) && (ctxt->states != (xmlRelaxNGStatesPtr)0x0)) {
    xmlRelaxNGFreeValidState(ctxt,ctxt->state);
    ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
  }
  ppxVar1 = &ctxt->states;
  pxVar3 = ctxt->states;
  if (pxVar3 != (xmlRelaxNGStatesPtr)0x0) {
    if (pxVar3->nbState != 1) {
      ppxVar9 = &ctxt->state;
      ctxt->states = (xmlRelaxNGStatesPtr)0x0;
      uVar2 = ctxt->flags;
      ctxt->flags = uVar2 | 1;
      if (pxVar3->nbState < 1) {
        pxVar7 = (xmlRelaxNGStatesPtr)0x0;
        local_54 = 0;
      }
      else {
        lVar10 = 0;
        local_54 = 0;
        states = (xmlRelaxNGStatesPtr)0x0;
        do {
          ctxt->state = pxVar3->tabState[lVar10];
          ctxt->states = (xmlRelaxNGStatesPtr)0x0;
          iVar4 = xmlRelaxNGValidateState(ctxt,define);
          if ((ctxt->state != (xmlRelaxNGValidStatePtr)0x0) &&
             (*ppxVar1 != (xmlRelaxNGStatesPtr)0x0)) {
            xmlRelaxNGFreeValidState(ctxt,ctxt->state);
            ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
          }
          ppxVar5 = ppxVar9;
          if (iVar4 == 0) {
            pxVar7 = *ppxVar1;
            if (pxVar7 == (xmlRelaxNGStatesPtr)0x0) {
              if (states == (xmlRelaxNGStatesPtr)0x0) {
                lVar8 = (long)(int)local_54;
                local_54 = local_54 + 1;
                pxVar3->tabState[lVar8] = *ppxVar9;
                states = (xmlRelaxNGStatesPtr)0x0;
              }
              else {
                xmlRelaxNGAddStates(ctxt,states,*ppxVar9);
              }
              goto LAB_00185005;
            }
            if (states != (xmlRelaxNGStatesPtr)0x0) {
              pxVar7 = *ppxVar1;
              if (0 < pxVar7->nbState) {
                lVar8 = 0;
                do {
                  xmlRelaxNGAddStates(ctxt,states,pxVar7->tabState[lVar8]);
                  lVar8 = lVar8 + 1;
                  pxVar7 = ctxt->states;
                } while (lVar8 < pxVar7->nbState);
              }
              goto LAB_00184f7c;
            }
            *ppxVar1 = (xmlRelaxNGStatesPtr)0x0;
            if (0 < (int)local_54) {
              uVar6 = 0;
              do {
                xmlRelaxNGAddStates(ctxt,pxVar7,pxVar3->tabState[uVar6]);
                uVar6 = uVar6 + 1;
              } while (local_54 != uVar6);
            }
          }
          else {
            if (*ppxVar9 == (xmlRelaxNGValidStatePtr)0x0) {
              pxVar7 = states;
              if (*ppxVar1 == (xmlRelaxNGStatesPtr)0x0) goto LAB_0018500c;
              pxVar7 = *ppxVar1;
              if (0 < pxVar7->nbState) {
                lVar8 = 0;
                do {
                  xmlRelaxNGFreeValidState(ctxt,pxVar7->tabState[lVar8]);
                  lVar8 = lVar8 + 1;
                  pxVar7 = ctxt->states;
                } while (lVar8 < pxVar7->nbState);
              }
LAB_00184f7c:
              xmlRelaxNGFreeStates(ctxt,pxVar7);
              ppxVar5 = (xmlRelaxNGValidStatePtr *)ppxVar1;
            }
            else {
              xmlRelaxNGFreeValidState(ctxt,*ppxVar9);
            }
LAB_00185005:
            *ppxVar5 = (xmlRelaxNGValidStatePtr)0x0;
            pxVar7 = states;
          }
LAB_0018500c:
          lVar10 = lVar10 + 1;
          states = pxVar7;
        } while (lVar10 < pxVar3->nbState);
      }
      ctxt->flags = uVar2;
      if (pxVar7 == (xmlRelaxNGStatesPtr)0x0) {
        if (1 < (int)local_54) {
          pxVar3->nbState = local_54;
          *ppxVar1 = pxVar3;
          goto LAB_00185072;
        }
        if (local_54 == 1) {
          ctxt->state = *pxVar3->tabState;
          xmlRelaxNGFreeStates(ctxt,pxVar3);
          goto LAB_00185072;
        }
        xmlRelaxNGFreeStates(ctxt,pxVar3);
        iVar4 = -1;
        if (ctxt->states != (xmlRelaxNGStatesPtr)0x0) {
          xmlRelaxNGFreeStates(ctxt,ctxt->states);
          ctxt->states = (xmlRelaxNGStatesPtr)0x0;
        }
      }
      else {
        xmlRelaxNGFreeStates(ctxt,pxVar3);
        ctxt->states = pxVar7;
LAB_00185072:
        iVar4 = 0;
      }
      if (*ppxVar9 == (xmlRelaxNGValidStatePtr)0x0) {
        return iVar4;
      }
      if (*ppxVar1 == (xmlRelaxNGStatesPtr)0x0) {
        return iVar4;
      }
      xmlRelaxNGFreeValidState(ctxt,*ppxVar9);
      goto LAB_00185095;
    }
    if (pxVar3 != (xmlRelaxNGStatesPtr)0x0) {
      ctxt->state = *pxVar3->tabState;
      xmlRelaxNGFreeStates(ctxt,pxVar3);
      ctxt->states = (xmlRelaxNGStatesPtr)0x0;
    }
  }
  iVar4 = xmlRelaxNGValidateState(ctxt,define);
  if ((ctxt->state != (xmlRelaxNGValidStatePtr)0x0) && (*ppxVar1 != (xmlRelaxNGStatesPtr)0x0)) {
    xmlRelaxNGFreeValidState(ctxt,ctxt->state);
    ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
  }
  pxVar3 = *ppxVar1;
  if (pxVar3 == (xmlRelaxNGStatesPtr)0x0) {
    return iVar4;
  }
  if (pxVar3->nbState != 1) {
    return iVar4;
  }
  ctxt->state = *pxVar3->tabState;
  xmlRelaxNGFreeStates(ctxt,pxVar3);
  ppxVar9 = (xmlRelaxNGValidStatePtr *)ppxVar1;
LAB_00185095:
  *ppxVar9 = (xmlRelaxNGValidStatePtr)0x0;
  return iVar4;
}

Assistant:

static int
xmlRelaxNGValidateDefinition(xmlRelaxNGValidCtxtPtr ctxt,
                             xmlRelaxNGDefinePtr define)
{
    xmlRelaxNGStatesPtr states, res;
    int i, j, k, ret, oldflags;

    /*
     * We should NOT have both ctxt->state and ctxt->states
     */
    if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
        /* TODO */
        xmlRelaxNGFreeValidState(ctxt, ctxt->state);
        ctxt->state = NULL;
    }

    if ((ctxt->states == NULL) || (ctxt->states->nbState == 1)) {
        if (ctxt->states != NULL) {
            ctxt->state = ctxt->states->tabState[0];
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
        }
        ret = xmlRelaxNGValidateState(ctxt, define);
        if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
            /* TODO */
            xmlRelaxNGFreeValidState(ctxt, ctxt->state);
            ctxt->state = NULL;
        }
        if ((ctxt->states != NULL) && (ctxt->states->nbState == 1)) {
            ctxt->state = ctxt->states->tabState[0];
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
        }
        return (ret);
    }

    states = ctxt->states;
    ctxt->states = NULL;
    res = NULL;
    j = 0;
    oldflags = ctxt->flags;
    ctxt->flags |= FLAGS_IGNORABLE;
    for (i = 0; i < states->nbState; i++) {
        ctxt->state = states->tabState[i];
        ctxt->states = NULL;
        ret = xmlRelaxNGValidateState(ctxt, define);
        /*
         * We should NOT have both ctxt->state and ctxt->states
         */
        if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
            /* TODO */
            xmlRelaxNGFreeValidState(ctxt, ctxt->state);
            ctxt->state = NULL;
        }
        if (ret == 0) {
            if (ctxt->states == NULL) {
                if (res != NULL) {
                    /* add the state to the container */
                    xmlRelaxNGAddStates(ctxt, res, ctxt->state);
                    ctxt->state = NULL;
                } else {
                    /* add the state directly in states */
                    states->tabState[j++] = ctxt->state;
                    ctxt->state = NULL;
                }
            } else {
                if (res == NULL) {
                    /* make it the new container and copy other results */
                    res = ctxt->states;
                    ctxt->states = NULL;
                    for (k = 0; k < j; k++)
                        xmlRelaxNGAddStates(ctxt, res,
                                            states->tabState[k]);
                } else {
                    /* add all the new results to res and reff the container */
                    for (k = 0; k < ctxt->states->nbState; k++)
                        xmlRelaxNGAddStates(ctxt, res,
                                            ctxt->states->tabState[k]);
                    xmlRelaxNGFreeStates(ctxt, ctxt->states);
                    ctxt->states = NULL;
                }
            }
        } else {
            if (ctxt->state != NULL) {
                xmlRelaxNGFreeValidState(ctxt, ctxt->state);
                ctxt->state = NULL;
            } else if (ctxt->states != NULL) {
                for (k = 0; k < ctxt->states->nbState; k++)
                    xmlRelaxNGFreeValidState(ctxt,
                                             ctxt->states->tabState[k]);
                xmlRelaxNGFreeStates(ctxt, ctxt->states);
                ctxt->states = NULL;
            }
        }
    }
    ctxt->flags = oldflags;
    if (res != NULL) {
        xmlRelaxNGFreeStates(ctxt, states);
        ctxt->states = res;
        ret = 0;
    } else if (j > 1) {
        states->nbState = j;
        ctxt->states = states;
        ret = 0;
    } else if (j == 1) {
        ctxt->state = states->tabState[0];
        xmlRelaxNGFreeStates(ctxt, states);
        ret = 0;
    } else {
        ret = -1;
        xmlRelaxNGFreeStates(ctxt, states);
        if (ctxt->states != NULL) {
            xmlRelaxNGFreeStates(ctxt, ctxt->states);
            ctxt->states = NULL;
        }
    }
    if ((ctxt->state != NULL) && (ctxt->states != NULL)) {
        /* TODO */
        xmlRelaxNGFreeValidState(ctxt, ctxt->state);
        ctxt->state = NULL;
    }
    return (ret);
}